

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

int __thiscall
CVmObjByteArray::getp_unpackBytes
          (CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int32_t iVar2;
  unsigned_long uVar3;
  int *in_RCX;
  vm_val_t *in_RDX;
  undefined8 in_RDI;
  CVmByteArraySource src;
  size_t fmtlen;
  char *fmt;
  long idx;
  uint argc;
  vm_val_t *in_stack_ffffffffffffff48;
  CVmByteArraySource *this_00;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  vm_val_t *in_stack_ffffffffffffff58;
  unsigned_long uVar4;
  int local_9c;
  vm_obj_id_t arr;
  CVmDataSource in_stack_ffffffffffffff70;
  unsigned_long local_48;
  CVmDataSource *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  arr = (vm_obj_id_t)((ulong)in_RDI >> 0x20);
  if (in_RCX == (int *)0x0) {
    local_9c = 0;
  }
  else {
    local_9c = *in_RCX;
  }
  if ((getp_unpackBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_unpackBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_unpackBytes::desc,2);
    __cxa_guard_release(&getp_unpackBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff58,
                     (uint *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff48);
  if (iVar1 == 0) {
    iVar2 = CVmBif::pop_long_val();
    local_48 = (unsigned_long)iVar2;
    local_9c = local_9c + -1;
    if ((long)local_48 < 1) {
      local_48 = 1;
    }
    else {
      uVar4 = local_48;
      uVar3 = get_element_count((CVmObjByteArray *)0x318381);
      if (uVar3 < uVar4) {
        local_48 = get_element_count((CVmObjByteArray *)0x318398);
      }
    }
    iVar1 = 0;
    CVmStack::get(0);
    vm_val_t::get_as_string(in_stack_ffffffffffffff48);
    vmb_get_len((char *)0x3183c3);
    this_00 = (CVmByteArraySource *)&stack0xffffffffffffff70;
    CVmByteArraySource::CVmByteArraySource
              ((CVmByteArraySource *)in_stack_ffffffffffffff70._vptr_CVmDataSource,arr);
    CVmByteArraySource::seek(this_00,local_48 - 1,iVar1);
    CVmPack::unpack(in_RDX,(char *)in_RCX,CONCAT44(local_9c,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8);
    CVmStack::discard(local_9c);
    CVmByteArraySource::~CVmByteArraySource((CVmByteArraySource *)0x318443);
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_unpackBytes(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = oargc != 0 ? *oargc : 0;
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the starting index from the first argument */
    long idx = CVmBif::pop_long_val(vmg0_);
    --argc;

    /* limit the index to 1..length */
    if (idx < 1)
        idx = 1;
    else if ((ulong)idx > get_element_count())
        idx = get_element_count();

    /* get the format string, but leave it on the stack for gc protection */
    const char *fmt = G_stk->get(0)->get_as_string(vmg0_);

    /* get the format string length and buffer pointer */
    size_t fmtlen = vmb_get_len(fmt);
    fmt += VMB_LEN;

    /* set up a data source for the byte array */
    CVmByteArraySource src(vmg_ self);

    /* seek to the starting index */
    src.seek(idx - 1, OSFSK_SET);

    /* do the unpacking */
    CVmPack::unpack(vmg_ retval, fmt, fmtlen, &src);

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}